

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int sign_byte_sequence(uint8_t *hash_result,EC_KEY *priv_key,uint8_t alg,
                      rtr_signature_seg *new_signature)

{
  undefined7 in_register_00000011;
  int iVar1;
  long in_FS_OFFSET;
  uint sig_res;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  iVar1 = -6;
  if ((int)CONCAT71(in_register_00000011,alg) == 1) {
    iVar1 = 0;
    ECDSA_sign(0,hash_result,0x20,new_signature->signature,&local_24,(EC_KEY *)priv_key);
    if (local_24 == 0) {
      iVar1 = -5;
    }
    else {
      new_signature->sig_len = (uint16_t)local_24;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int sign_byte_sequence(uint8_t *hash_result, EC_KEY *priv_key, uint8_t alg, struct rtr_signature_seg *new_signature)
{
	enum rtr_bgpsec_rtvals retval = RTR_BGPSEC_SUCCESS;
	unsigned int sig_res = 0;

	if (alg == RTR_BGPSEC_ALGORITHM_SUITE_1) {
		ECDSA_sign(0, hash_result, SHA256_DIGEST_LENGTH, new_signature->signature, &sig_res, priv_key);
		if (sig_res < 1)
			retval = RTR_BGPSEC_SIGNING_ERROR;
		else
			new_signature->sig_len = sig_res;
	} else {
		retval = RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
	}

	return retval;
}